

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLEVER.cpp
# Opt level: O3

void __thiscall
CLEVER::addAlignment
          (CLEVER *this,
          unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *alignment_autoptr,
          int *edgecounter,int *nonEdgeCounter,int numGCAllowedPos,int ct)

{
  size_t *psVar1;
  pointer *ppuVar2;
  EdgeCalculator *pEVar3;
  AlignmentRecord *this_00;
  LogWriter *this_01;
  clique_list_t *pcVar4;
  pointer puVar5;
  Clique *this_02;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  alignment_id_t aVar9;
  alignment_id_t v2;
  uint uVar10;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  size_type sVar13;
  Clique *pCVar14;
  Clique **ppCVar15;
  _List_node_base *p_Var16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Clique **ppCVar20;
  _List_node_base *p_Var21;
  Clique *clique;
  Clique *split_off_clique;
  alignment_set_t adjacent;
  pair<unsigned_int,_unsigned_long> local_b8;
  Clique **local_a8;
  _Head_base<0UL,_Clique_*,_false> local_98;
  AlignmentRecord *local_90;
  _Head_base<0UL,_Clique_*,_false> local_88;
  uint local_80;
  uint local_7c;
  size_type local_78;
  undefined1 local_70 [64];
  
  aVar9 = (this->super_CliqueFinder).next_id;
  (this->super_CliqueFinder).next_id = aVar9 + 1;
  local_90 = (alignment_autoptr->_M_t).
             super___uniq_ptr_impl<AlignmentRecord,_std::default_delete<AlignmentRecord>_>._M_t.
             super__Tuple_impl<0UL,_AlignmentRecord_*,_std::default_delete<AlignmentRecord>_>.
             super__Head_base<0UL,_AlignmentRecord_*,_false>._M_head_impl;
  (alignment_autoptr->_M_t).
  super___uniq_ptr_impl<AlignmentRecord,_std::default_delete<AlignmentRecord>_>._M_t.
  super__Tuple_impl<0UL,_AlignmentRecord_*,_std::default_delete<AlignmentRecord>_>.
  super__Head_base<0UL,_AlignmentRecord_*,_false>._M_head_impl = (AlignmentRecord *)0x0;
  local_80 = numGCAllowedPos;
  local_7c = ct;
  local_70._16_8_ = edgecounter;
  local_70._24_8_ = nonEdgeCounter;
  AlignmentRecord::setID(local_90,aVar9);
  local_78 = (this->super_CliqueFinder).alignment_count;
  sVar13 = this->capacity;
  if (local_78 == sVar13) {
    reorganize_storage(this);
    local_78 = (this->super_CliqueFinder).alignment_count;
    sVar13 = this->capacity;
  }
  (this->super_CliqueFinder).alignment_count = local_78 + 1;
  this->alignments[local_78] = local_90;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)(local_70 + 0x20),
             sVar13,0,(allocator<unsigned_long> *)&local_b8);
  p_Var11 = (this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar13 = local_78;
  while (local_78 = sVar13,
        (_Rb_tree_header *)p_Var11 !=
        &(this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header) {
    pEVar3 = (this->super_CliqueFinder).edge_calculator;
    this_00 = this->alignments[(long)p_Var11[1]._M_parent];
    iVar8 = (*pEVar3->_vptr_EdgeCalculator[2])
                      (pEVar3,local_90,this_00,(ulong)local_80,(ulong)local_7c);
    if (((char)iVar8 == '\0') ||
       ((pEVar3 = (this->super_CliqueFinder).second_edge_calculator, pEVar3 != (EdgeCalculator *)0x0
        && (iVar8 = (*pEVar3->_vptr_EdgeCalculator[2])
                              (pEVar3,local_90,this_00,(ulong)local_80,(ulong)local_7c),
           (char)iVar8 == '\0')))) {
      *(int *)local_70._24_8_ = *(int *)local_70._24_8_ + 1;
    }
    else {
      *(int *)local_70._16_8_ = *(int *)local_70._16_8_ + 1;
      ppuVar2 = &(((buffer_type *)local_70._32_8_)->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start + ((ulong)p_Var11[1]._M_parent >> 6);
      *ppuVar2 = (pointer)((ulong)*ppuVar2 | 1L << ((byte)p_Var11[1]._M_parent & 0x3f));
      this_01 = this->lw;
      if (this_01 != (LogWriter *)0x0) {
        aVar9 = AlignmentRecord::getID(local_90);
        v2 = AlignmentRecord::getID(this_00);
        LogWriter::reportEdge(this_01,aVar9,v2);
      }
      (this->super_CliqueFinder).converged = false;
    }
    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    sVar13 = local_78;
  }
  local_b8._0_8_ = (ulong)(uint)local_b8._4_4_ << 0x20;
  local_b8.second = sVar13;
  std::
  _Rb_tree<std::pair<unsigned_int,unsigned_long>,std::pair<unsigned_int,unsigned_long>,std::_Identity<std::pair<unsigned_int,unsigned_long>>,std::less<std::pair<unsigned_int,unsigned_long>>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
  ::_M_insert_unique<std::pair<unsigned_int,unsigned_long>>
            ((_Rb_tree<std::pair<unsigned_int,unsigned_long>,std::pair<unsigned_int,unsigned_long>,std::_Identity<std::pair<unsigned_int,unsigned_long>>,std::less<std::pair<unsigned_int,unsigned_long>>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
              *)&this->alignments_by_length,&local_b8);
  pcVar4 = (this->super_CliqueFinder).cliques;
  p_Var16 = (pcVar4->super__List_base<Clique_*,_std::allocator<Clique_*>_>)._M_impl._M_node.
            super__List_node_base._M_next;
  local_b8._0_8_ = (Clique **)0x0;
  local_b8.second = 0;
  local_a8 = (Clique **)0x0;
  if (p_Var16 != (_List_node_base *)pcVar4) {
    do {
      local_98._M_head_impl = (Clique *)p_Var16[1]._M_next;
      uVar19 = (local_98._M_head_impl)->rightmost_segment_end;
      uVar10 = AlignmentRecord::getIntervalStart(local_90);
      if (uVar19 < uVar10) {
        p_Var21 = (((_List_base<Clique_*,_std::allocator<Clique_*>_> *)&p_Var16->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next;
        psVar1 = &(((this->super_CliqueFinder).cliques)->
                  super__List_base<Clique_*,_std::allocator<Clique_*>_>)._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var16);
        local_88._M_head_impl = local_98._M_head_impl;
        CliqueCollector::add
                  ((this->super_CliqueFinder).clique_collector,
                   (unique_ptr<Clique,_std::default_delete<Clique>_> *)&local_88,this->appearanceMap
                  );
        if (local_88._M_head_impl != (Clique *)0x0) {
          (*(local_88._M_head_impl)->_vptr_Clique[1])();
        }
        local_88._M_head_impl = (Clique *)0x0;
        p_Var16 = p_Var21;
      }
      else {
        Clique::intersect((Clique *)local_70,(alignment_set_t *)local_98._M_head_impl);
        puVar5 = (((buffer_type *)local_70._0_8_)->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = (long)(((buffer_type *)local_70._0_8_)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar5;
        if (lVar12 == 0) {
LAB_0014fa9b:
          p_Var21 = p_Var16->_M_next;
        }
        else {
          uVar19 = lVar12 >> 3;
          if (*puVar5 == 0) {
            uVar18 = 1;
            do {
              uVar17 = uVar18;
              if (uVar19 + (uVar19 == 0) == uVar17) break;
              uVar18 = uVar17 + 1;
            } while (puVar5[uVar17] == 0);
            if (uVar19 <= uVar17) goto LAB_0014fa9b;
          }
          sVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                             ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              local_70._0_8_);
          if (sVar13 != (local_98._M_head_impl)->alignment_count) {
            pCVar14 = (Clique *)operator_new(0x30);
            Clique::Clique(pCVar14,&this->super_CliqueFinder,
                           (unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)local_70);
            local_70._8_8_ = pCVar14;
            Clique::add(pCVar14,local_78);
            if ((Clique **)local_b8.second == local_a8) {
              std::vector<Clique*,std::allocator<Clique*>>::_M_realloc_insert<Clique*const&>
                        ((vector<Clique*,std::allocator<Clique*>> *)&local_b8,
                         (iterator)local_b8.second,(Clique **)(local_70 + 8));
            }
            else {
              *(undefined8 *)local_b8.second = local_70._8_8_;
              local_b8.second = local_b8.second + 8;
            }
            goto LAB_0014fa9b;
          }
          Clique::add(local_98._M_head_impl,local_78);
          if ((Clique **)local_b8.second == local_a8) {
            std::vector<Clique*,std::allocator<Clique*>>::_M_realloc_insert<Clique*const&>
                      ((vector<Clique*,std::allocator<Clique*>> *)&local_b8,
                       (iterator)local_b8.second,&local_98._M_head_impl);
          }
          else {
            *(Clique **)local_b8.second = local_98._M_head_impl;
            local_b8.second = local_b8.second + 8;
          }
          p_Var21 = p_Var16->_M_next;
          psVar1 = &(((this->super_CliqueFinder).cliques)->
                    super__List_base<Clique_*,_std::allocator<Clique_*>_>)._M_impl._M_node._M_size;
          *psVar1 = *psVar1 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var16);
        }
        uVar6 = local_70._0_8_;
        p_Var16 = p_Var21;
        if ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_70._0_8_ !=
            (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
          puVar5 = (((buffer_type *)local_70._0_8_)->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar5 != (pointer)0x0) {
            operator_delete(puVar5);
          }
          operator_delete((void *)uVar6);
        }
      }
    } while (p_Var16 != (_List_node_base *)(this->super_CliqueFinder).cliques);
    sVar13 = local_78;
    if (local_b8.second != local_b8._0_8_) goto LAB_0014fb37;
  }
  pCVar14 = (Clique *)operator_new(0x30);
  Clique::Clique(pCVar14,&this->super_CliqueFinder,sVar13,this->capacity);
  local_98._M_head_impl = pCVar14;
  if ((Clique **)local_b8.second == local_a8) {
    std::vector<Clique*,std::allocator<Clique*>>::_M_realloc_insert<Clique*>
              ((vector<Clique*,std::allocator<Clique*>> *)&local_b8,(iterator)local_b8.second,
               &local_98._M_head_impl);
  }
  else {
    *(Clique **)local_b8.second = pCVar14;
    local_b8.second = local_b8.second + 8;
  }
LAB_0014fb37:
  ppCVar15 = (Clique **)local_b8.second;
  ppCVar20 = (Clique **)local_b8._0_8_;
  if (local_b8.second != local_b8._0_8_) {
    uVar19 = 0;
    do {
      pCVar14 = ppCVar20[uVar19];
      uVar18 = uVar19 + 1;
      if ((pCVar14 != (Clique *)0x0) &&
         (uVar17 = uVar18, uVar18 < (ulong)((long)ppCVar15 - (long)ppCVar20 >> 3))) {
        do {
          this_02 = ppCVar20[uVar17];
          if (this_02 != (Clique *)0x0) {
            if (this_02->alignment_count < pCVar14->alignment_count) {
              bVar7 = Clique::contains(pCVar14,this_02);
              if (bVar7) {
                (*this_02->_vptr_Clique[1])(this_02);
                *(Clique **)(local_b8._0_8_ + uVar17 * 8) = (Clique *)0x0;
              }
            }
            else {
              bVar7 = Clique::contains(this_02,pCVar14);
              if (bVar7) {
                (*pCVar14->_vptr_Clique[1])(pCVar14);
                *(Clique **)(local_b8._0_8_ + uVar19 * 8) = (Clique *)0x0;
                ppCVar15 = (Clique **)local_b8.second;
                ppCVar20 = (Clique **)local_b8._0_8_;
                break;
              }
            }
          }
          uVar17 = uVar17 + 1;
          ppCVar15 = (Clique **)local_b8.second;
          ppCVar20 = (Clique **)local_b8._0_8_;
        } while (uVar17 < (ulong)((long)(local_b8.second - local_b8._0_8_) >> 3));
      }
      uVar19 = uVar18;
    } while (uVar18 < (ulong)((long)ppCVar15 - (long)ppCVar20 >> 3));
  }
  if (ppCVar15 != ppCVar20) {
    uVar19 = 0;
    do {
      if (ppCVar20[uVar19] != (Clique *)0x0) {
        pcVar4 = (this->super_CliqueFinder).cliques;
        p_Var16 = (_List_node_base *)operator_new(0x18);
        p_Var16[1]._M_next = (_List_node_base *)ppCVar20[uVar19];
        std::__detail::_List_node_base::_M_hook(p_Var16);
        psVar1 = &(pcVar4->super__List_base<Clique_*,_std::allocator<Clique_*>_>)._M_impl._M_node.
                  _M_size;
        *psVar1 = *psVar1 + 1;
        ppCVar15 = (Clique **)local_b8.second;
        ppCVar20 = (Clique **)local_b8._0_8_;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < (ulong)((long)ppCVar15 - (long)ppCVar20 >> 3));
  }
  if (ppCVar20 != (Clique **)0x0) {
    operator_delete(ppCVar20);
  }
  if ((alignment_set_t *)local_70._32_8_ != (alignment_set_t *)0x0) {
    operator_delete((void *)local_70._32_8_);
  }
  return;
}

Assistant:

void CLEVER::addAlignment(std::unique_ptr<AlignmentRecord>& alignment_autoptr, int& edgecounter, int& nonEdgeCounter, int numGCAllowedPos, int ct) {
    assert(alignment_autoptr.get() != 0);
	assert(cliques!=0);
    assert(initialized);

	alignment_id_t id = next_id++;
	AlignmentRecord* alignment = alignment_autoptr.release();
	alignment->setID(id);

	// store new alignment
	if (alignment_count==capacity) {
		reorganize_storage();
	}
	size_t index = alignment_count++;
	alignments[index] = alignment;

	// TODO: Once edge criteria are fixed, we can try to (re-)gain some efficiency here...
// 	if (single_end) {
		
// 	} else {
// 		alignments_by_length.insert(make_pair(alignment->getInsertLength(), index));
// 	}
	// determine all edges from current alignment pair
	alignment_set_t adjacent(capacity);
	// determine range of insert lengths to be searched
	typedef set<length_and_index_t>::const_iterator iterator_t;
	iterator_t it = alignments_by_length.begin();
	iterator_t end = alignments_by_length.end();
	// iterate through all alignments
	for (; it!=end; ++it) {
		const AlignmentRecord* alignment2 = alignments[it->second];

        //if(alignment->getName().find("normal14") != string::npos && alignment2->getName().find("normal14") != string::npos){
        //       int k = 0;
        //}
		// cerr << "  comparing to " << alignments[it->second]->getID() << ", length " << it->first << ", read group: " << alignments[it->second]->getReadGroup();
        bool set_edge = edge_calculator.edgeBetween(*alignment, *alignment2,numGCAllowedPos,ct);
        //if(a1.getName().find("Clique") != string::npos && a2.getName().find("Clique") != string::npos){
        //FOR DEBUGGING
        //}
        if (set_edge && (second_edge_calculator != nullptr)) {
            set_edge = second_edge_calculator->edgeBetween(*alignment,*alignment2,numGCAllowedPos,ct);
		}
		if (set_edge) {
            edgecounter++;
            //cout << "Edge: " << alignment->getName() << " and " << alignment2->getName() << endl;
			adjacent.set(it->second, true);
			// cerr << " --> EDGE";
			if (lw != nullptr) {
                lw->reportEdge(alignment->getID(), alignment2->getID());
            }
            converged = false;
        }else{
            nonEdgeCounter++;
        }
		// cerr << endl;
	}

    alignments_by_length.insert(make_pair(0, index));

	// iterate over all active cliques. output those that lie left of current segment and
	// check intersection with current node for the rest
	clique_list_t::iterator clique_it = cliques->begin();
	// cliques that contain the newly added alignment and
	// therefore need to be checked for subset relations,
	// i.e. if one of these cliques is contained in another,
	// it must be discarded as it is not maximal.
	vector<Clique*> new_cliques;
	while (clique_it!=cliques->end()) {
		Clique* clique = *clique_it;
		if (clique->rightmostSegmentEnd() < alignment->getIntervalStart()) {
			clique_it = cliques->erase(clique_it);
            clique_collector.add(unique_ptr<Clique>(clique),this->appearanceMap);
		} else {
			// is there an intersection between nodes adjacent to the new
			// alignment and the currently considered clique?
			unique_ptr<alignment_set_t> intersection = clique->intersect(adjacent);
			if (intersection->any()) {
				// is node adjacent to all nodes in the clique?
				if (intersection->count() == clique->size()) {
					// cout << "   Adding to clique " << (*clique) << endl;
					clique->add(index);
					new_cliques.push_back(clique);
					clique_it = cliques->erase(clique_it);
				} else {
					Clique* split_off_clique = new Clique(*this, intersection);
					split_off_clique->add(index);
					// cout << "   Splitting off clique " << (*clique) << " --> " << (*split_off_clique) << endl;
					new_cliques.push_back(split_off_clique);
					++clique_it;
				}
			} else {
				// cout << "   Empty intersection for clique " << (*clique) << endl;
				++clique_it;
			}
		}
	}
	// if current alignment has not been assigned to at least one
	// of the existing cliques, let it form its own singleton clique
	if (new_cliques.size() == 0) {
		new_cliques.push_back(new Clique(*this, index, capacity));
	}

	// check for subset relations and delete cliques that are subsets of others
	for (size_t i=0; i<new_cliques.size(); ++i) {
		if (new_cliques[i]==0) continue;
		Clique* clique_i = new_cliques[i];
		for (size_t j=i+1; j<new_cliques.size(); ++j) {
			if (new_cliques[j]==0) continue;
			Clique* clique_j = new_cliques[j];
			if (clique_i->size()<=clique_j->size()) {
				if (clique_j->contains(*clique_i)) {
					// cout << "Removing duplicate or non-maximal clique!" << endl;
					delete clique_i;
					new_cliques[i] = nullptr;
					break;
				}
			} else {
				if (clique_i->contains(*clique_j)) {
					// cout << "Removing duplicate or non-maximal clique!" << endl;
					delete clique_j;
					new_cliques[j] = nullptr;
					continue;
				}
			}
		}
	}
	//double cpu_time = (double) (clock() - clock_start) / CLOCKS_PER_SEC;
	//int clique_size_new = 0;
	for (size_t i=0; i<new_cliques.size(); ++i) {
		if (new_cliques[i]!=nullptr) {
			cliques->push_back(new_cliques[i]);
			//clique_size_new++;
		}
	}

	//cout << cliques->size() << "\t" << alignment_count << "\t" << clique_size_old << "\t" << clique_size_new << "\t" << cpu_time << "\t" << no_sort << endl;
    /*cout << "  Current Alignments: ";
	for (size_t i=0; i<alignment_count; ++i) {
		cout << alignments[i]->getID() << " ";
	}
	cout << endl;
	cout << "  Current cliques:"<<  endl;
	for (clique_it = cliques->begin();clique_it!=cliques->end(); ++clique_it) {
		cout << "    " << **clique_it << endl;
    }*/

}